

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O2

void __thiscall slang::parsing::NumberParser::checkIntOverflow(NumberParser *this,Token token)

{
  LanguageVersion LVar1;
  Token token_00;
  logic_t lVar2;
  SVInt local_50;
  Token local_40;
  undefined8 local_30;
  Info *local_28;
  
  local_28 = token.info;
  local_30 = token._0_8_;
  LVar1 = this->languageVersion;
  Token::intValue(&local_40);
  SVInt::SVInt<int>(&local_50,0x7fffffff);
  lVar2 = SVInt::operator>((SVInt *)&local_40,&local_50);
  if ((int)LVar1 < 1) {
    SVInt::~SVInt(&local_50);
    SVInt::~SVInt((SVInt *)&local_40);
    if (((lVar2.value != '\0') && (lVar2.value != 0x80)) && (lVar2.value != '@')) {
      token_00.info = local_28;
      token_00.kind = (undefined2)local_30;
      token_00._2_1_ = local_30._2_1_;
      token_00.numFlags.raw = local_30._3_1_;
      token_00.rawLen = local_30._4_4_;
      reportIntOverflow(this,token_00);
    }
  }
  else {
    SVInt::~SVInt(&local_50);
    SVInt::~SVInt((SVInt *)&local_40);
  }
  return;
}

Assistant:

void checkIntOverflow(Token token) {
        if (languageVersion < LanguageVersion::v1800_2023 && token.intValue() > INT32_MAX)
            reportIntOverflow(token);
    }